

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ktxsc.cpp
# Opt level: O2

void __thiscall ktxSupercompressor::usage(ktxSupercompressor *this)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Usage: ");
  poVar1 = std::operator<<(poVar1,(string *)&(this->super_scApp).super_ktxApp.name);
  std::operator<<(poVar1,
                  " [options] [<infile> ...]\n\n  infile       The ktx2 file(s) to supercompress. The output is written to a\n               file of the same name. If infile not specified input will be read\n               from stdin and the compressed texture written to stdout.\n\n  Options are:\n\n  -o outfile, --output=outfile\n               Writes the output to outfile. If outfile is \'stdout\', output\n               will be written to stdout. Parent directories will be\n               created if necessary. If there is more than 1 input file\n               the command prints its usage message and exits.\n  -f, --force  If the output file cannot be opened, remove it and create a\n               new file, without prompting for confirmation regardless of\n               its permissions.\n"
                 );
  scApp::usage(&this->super_scApp);
  return;
}

Assistant:

void
ktxSupercompressor::usage()
{
    cerr <<
        "Usage: " << name  << " [options] [<infile> ...]\n"
        "\n"
        "  infile       The ktx2 file(s) to supercompress. The output is written to a\n"
        "               file of the same name. If infile not specified input will be read\n"
        "               from stdin and the compressed texture written to stdout.\n"
        "\n"
        "  Options are:\n"
        "\n"
        "  -o outfile, --output=outfile\n"
        "               Writes the output to outfile. If outfile is 'stdout', output\n"
        "               will be written to stdout. Parent directories will be\n"
        "               created if necessary. If there is more than 1 input file\n"
        "               the command prints its usage message and exits.\n"
        "  -f, --force  If the output file cannot be opened, remove it and create a\n"
        "               new file, without prompting for confirmation regardless of\n"
        "               its permissions.\n";
        scApp::usage();
}